

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::clearBasis(SoPlexBase<double> *this)

{
  Status SVar1;
  SPxSolverBase<double> *in_RDI;
  SPxSolverBase<double> *this_00;
  
  this_00 = in_RDI;
  SPxSolverBase<double>::reLoad(in_RDI);
  SVar1 = SPxSolverBase<double>::status(this_00);
  *(Status *)&in_RDI[8].solveVector2rhs = SVar1;
  *(undefined1 *)
   &in_RDI[8].theTest.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = 0;
  SLUFactorRational::clear((SLUFactorRational *)in_RDI);
  return;
}

Assistant:

void SoPlexBase<R>::clearBasis()
{
   _solver.reLoad();
   _status = _solver.status();
   _hasBasis = false;
   _rationalLUSolver.clear();
}